

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O2

void __thiscall
antlr::RecognitionException::RecognitionException(RecognitionException *this,string *s)

{
  ANTLRException::ANTLRException(&this->super_ANTLRException,s);
  (this->super_ANTLRException)._vptr_ANTLRException =
       (_func_int **)&PTR__RecognitionException_0021ac28;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  this->line = -1;
  this->column = -1;
  return;
}

Assistant:

RecognitionException::RecognitionException(const ANTLR_USE_NAMESPACE(std)string& s)
: ANTLRException(s)
, line(-1)
, column(-1)
{
}